

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical.cxx
# Opt level: O1

void __thiscall Unit::dimensionless(Unit *this)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  
  setNames(this);
  lVar3 = 1;
  bVar1 = false;
  do {
    if (this->siUnits[lVar3 + -1] != 0) {
      bVar1 = true;
    }
    this->siUnits[lVar3 + -1] = 0;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"warning: using(",0xf);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(this->sUnitName)._M_dataplus._M_p,
                        (this->sUnitName)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,") as argument to a dimensionless function.",0x2a);
    std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  setNames(this);
  return;
}

Assistant:

void Unit::dimensionless()
{
	setNames();
	bool warning = false;
	for(int i=0; i<7; i++) {
		if (siUnits[i])
			warning = true;
		siUnits[i] = 0;
	}
	if (warning)
		cout << "warning: using(" << sUnitName << ") as argument to a dimensionless function." << endl;
	setNames();
}